

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O0

bool __thiscall
miniros::master::ParameterStorage::unsubscribeParam
          (ParameterStorage *this,string *caller_id,string *caller_api,string *key)

{
  bool bVar1;
  Error EVar2;
  undefined8 uVar3;
  undefined8 unaff_RBX;
  long in_RDI;
  undefined1 uVar4;
  string *unaff_retaddr;
  string *in_stack_00000008;
  shared_ptr<miniros::master::NodeRef> nodeRef;
  iterator it;
  scoped_lock<std::mutex> lock;
  Path path;
  string fullKey;
  bool enabled;
  char *in_stack_fffffffffffffe58;
  Path *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  LogLocation *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  Level in_stack_fffffffffffffe84;
  RegistrationManager *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Level LVar5;
  char *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  _Self local_130;
  _Self local_128 [2];
  Error_t local_114;
  string local_c0 [35];
  undefined1 local_9d;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [64];
  undefined1 _remap;
  
  _remap = (undefined1)((ulong)unaff_RBX >> 0x38);
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((unsubscribeParam::loc.initialized_ ^ 0xffU) & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    ::std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
    ::std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
    console::initializeLogLocation
              ((LogLocation *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (string *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
    ::std::__cxx11::string::~string(local_48);
    ::std::__cxx11::string::~string(local_68);
    ::std::__cxx11::string::~string(local_88);
    ::std::allocator<char>::~allocator(&local_89);
  }
  if (unsubscribeParam::loc.level_ != Info) {
    console::setLogLocationLevel
              ((LogLocation *)in_stack_fffffffffffffe60,
               (Level)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    console::checkLogLocationEnabled(in_stack_fffffffffffffe70);
  }
  uVar4 = (unsubscribeParam::loc.logger_enabled_ & 1U) != 0;
  local_9d = uVar4;
  if ((bool)uVar4) {
    in_stack_fffffffffffffe88 = (RegistrationManager *)unsubscribeParam::loc.logger_;
    LVar5 = unsubscribeParam::loc.level_;
    in_stack_fffffffffffffe60 = (Path *)::std::__cxx11::string::c_str();
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::__cxx11::string::c_str();
    uVar3 = ::std::__cxx11::string::c_str();
    in_stack_fffffffffffffe58 = "unsubscribeParam(\"%s\") from %s, api=%s";
    console::print((FilterBase *)0x0,in_stack_fffffffffffffe88,(Level)(ulong)LVar5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x12e,
                   "bool miniros::master::ParameterStorage::unsubscribeParam(const std::string &, const std::string &, const std::string &)"
                   ,"unsubscribeParam(\"%s\") from %s, api=%s",in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffea0,uVar3);
  }
  names::resolve(in_stack_00000008,unaff_retaddr,(bool)_remap);
  names::Path::Path(in_stack_fffffffffffffe60);
  EVar2 = names::Path::fromString
                    ((Path *)CONCAT17(uVar4,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
  local_114 = EVar2.code;
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe60,
             (mutex_type *)in_stack_fffffffffffffe58);
  if (*(long *)(in_RDI + 0x90) != 0) {
    local_128[0]._M_node =
         (_Base_ptr)
         ::std::
         map<miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
         ::find((map<miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
                 *)in_stack_fffffffffffffe58,(key_type *)0x55390e);
    local_130._M_node =
         (_Base_ptr)
         ::std::
         map<miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
         ::end((map<miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
                *)in_stack_fffffffffffffe58);
    bVar1 = ::std::operator!=(local_128,&local_130);
    if (bVar1) {
      RegistrationManager::getNodeByName
                (in_stack_fffffffffffffe88,(string *)CONCAT44(EVar2.code,in_stack_fffffffffffffe80))
      ;
      ::std::
      _Rb_tree_iterator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>
                    *)0x55397d);
      ::std::
      set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
      ::erase((set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
               *)in_stack_fffffffffffffe60,(key_type *)in_stack_fffffffffffffe58);
      ::std::shared_ptr<miniros::master::NodeRef>::~shared_ptr
                ((shared_ptr<miniros::master::NodeRef> *)0x55399a);
    }
  }
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x553a10);
  names::Path::~Path(in_stack_fffffffffffffe60);
  ::std::__cxx11::string::~string(local_c0);
  return true;
}

Assistant:

bool ParameterStorage::unsubscribeParam(
  const std::string& caller_id, const std::string& caller_api, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "unsubscribeParam(\"%s\") from %s, api=%s", key.c_str(), caller_id.c_str(), caller_api.c_str());

  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  names::Path path;
  path.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  if (m_regManager) {
    auto it = m_parameterListeners.find(path);
    if (it != m_parameterListeners.end()) {
      std::shared_ptr<NodeRef> nodeRef = m_regManager->getNodeByName(caller_id);
      it->second.erase(nodeRef);
    }
  }
  return true;
}